

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O1

int __thiscall BpTree<int>::CanFit(BpTree<int> *this,IndexNode<int> *A,IndexNode<int> *B)

{
  vector<char,_std::allocator<char>_> *__x;
  vector<Addr,_std::allocator<Addr>_> *__x_00;
  char cVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  vector<int,_std::allocator<int>_> local_1a8;
  vector<char,_std::allocator<char>_> local_190;
  vector<Addr,_std::allocator<Addr>_> local_178;
  Addr local_160;
  Addr AStack_158;
  char local_150;
  vector<int,_std::allocator<int>_> local_148;
  vector<char,_std::allocator<char>_> local_130;
  vector<Addr,_std::allocator<Addr>_> local_118;
  Addr local_100;
  Addr AStack_f8;
  char local_f0;
  vector<int,_std::allocator<int>_> local_e8;
  vector<char,_std::allocator<char>_> local_d0;
  vector<Addr,_std::allocator<Addr>_> local_b8;
  Addr local_a0;
  Addr AStack_98;
  char local_90;
  vector<int,_std::allocator<int>_> local_88;
  vector<char,_std::allocator<char>_> local_70;
  vector<Addr,_std::allocator<Addr>_> local_58;
  Addr local_40;
  Addr AStack_38;
  
  local_150 = A->NodeState;
  std::vector<int,_std::allocator<int>_>::vector(&local_148,&A->k);
  __x = &A->v;
  std::vector<char,_std::allocator<char>_>::vector(&local_130,__x);
  __x_00 = &A->p;
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_118,__x_00);
  local_100 = A->parent;
  AStack_f8 = A->self;
  if (local_150 == '1') {
    local_90 = B->NodeState;
    std::vector<int,_std::allocator<int>_>::vector(&local_88,&B->k);
    std::vector<char,_std::allocator<char>_>::vector(&local_70,&B->v);
    std::vector<Addr,_std::allocator<Addr>_>::vector(&local_58,&B->p);
    local_40 = B->parent;
    AStack_38 = B->self;
    bVar7 = local_90 == '1';
    if (local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar7 = false;
  }
  if (local_118.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_130.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_130.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (bVar7) {
    iVar2 = this->N;
    uVar3 = iVar2 - 1;
    uVar6 = 0;
    if (1 < iVar2) {
      uVar6 = 0;
      do {
        if ((__x->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_start[uVar6] != '1') goto LAB_00137664;
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
      uVar6 = (ulong)uVar3;
    }
LAB_00137664:
    uVar5 = 0;
    if (1 < iVar2) {
      uVar4 = 0;
      do {
        uVar5 = uVar4;
        if ((B->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar4] != '1') break;
        uVar4 = uVar4 + 1;
        uVar5 = (ulong)uVar3;
      } while (uVar3 != uVar4);
    }
    uVar3 = (uint)((int)uVar5 + (int)uVar6 < iVar2);
  }
  else {
    cVar1 = A->NodeState;
    std::vector<int,_std::allocator<int>_>::vector(&local_1a8,&A->k);
    std::vector<char,_std::allocator<char>_>::vector(&local_190,__x);
    std::vector<Addr,_std::allocator<Addr>_>::vector(&local_178,__x_00);
    local_160 = A->parent;
    AStack_158 = A->self;
    if (cVar1 == '1') {
      bVar7 = false;
    }
    else {
      local_f0 = B->NodeState;
      std::vector<int,_std::allocator<int>_>::vector(&local_e8,&B->k);
      std::vector<char,_std::allocator<char>_>::vector(&local_d0,&B->v);
      std::vector<Addr,_std::allocator<Addr>_>::vector(&local_b8,&B->p);
      local_a0 = B->parent;
      AStack_98 = B->self;
      bVar7 = local_f0 != '1';
      if (local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    if (local_178.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_178.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_178.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_178.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar6 = 0;
    uVar3 = 0;
    if (bVar7) {
      uVar3 = this->N;
      if (0 < (int)uVar3) {
        uVar6 = 0;
        do {
          if ((__x_00->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar6].FileOff == -1) goto LAB_001377f7;
          uVar6 = uVar6 + 1;
        } while (uVar3 != uVar6);
        uVar6 = (ulong)uVar3;
      }
LAB_001377f7:
      if ((int)uVar3 < 1) {
        uVar5 = 0;
      }
      else {
        uVar5 = 0;
        do {
          if ((B->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar5].FileOff == -1) goto LAB_00137816;
          uVar5 = uVar5 + 1;
        } while (uVar3 != uVar5);
        uVar5 = (ulong)uVar3;
      }
LAB_00137816:
      uVar3 = (uint)((int)uVar5 + (int)uVar6 <= (int)uVar3);
    }
  }
  return uVar3;
}

Assistant:

int BpTree<K>::CanFit(IndexNode<K> A, IndexNode<K> B) {
	int i, j;
	if (this->IsLeaf(A) && this->IsLeaf(B)){
		for (i = 0; i < N - 1 && A.v[i] == '1'; i++);
		for (j = 0; j < N - 1 && B.v[j] == '1'; j++);
		return i + j <= N - 1;
	}
	else if (!this->IsLeaf(A) && !this->IsLeaf(B)) {
		for (i = 0; i < N && A.p[i].FileOff != -1; i++);
		for (j = 0; j < N && B.p[j].FileOff != -1; j++);
		return i + j <= N;
	}
	else
		return 0;
}